

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoli.c
# Opt level: O0

int ffppni(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,short *array,short nulval,
          int *status)

{
  int iVar1;
  short *in_RDX;
  LONGLONG in_RSI;
  LONGLONG in_RDI;
  int unaff_retaddr;
  fitsfile *in_stack_00000008;
  short in_stack_00000020;
  short nullvalue;
  long row;
  void *in_stack_000000e8;
  int in_stack_000000f4;
  LONGLONG in_stack_000000f8;
  LONGLONG in_stack_00000100;
  int in_stack_0000010c;
  fitsfile *in_stack_00000110;
  void *in_stack_00000140;
  int *in_stack_00000148;
  fitsfile *in_stack_ffffffffffffff98;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffff98,(int *)0x234efa);
  if (iVar1 == 0) {
    ffpcni(in_stack_00000008,unaff_retaddr,
           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,in_RDX,
           in_stack_00000020,(int *)row);
    iVar1 = in_stack_00000008->HDUposition;
  }
  else {
    fits_write_compressed_pixels
              (in_stack_00000110,in_stack_0000010c,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f4,in_stack_000000e8,in_stack_00000140,in_stack_00000148);
    iVar1 = in_stack_00000008->HDUposition;
  }
  return iVar1;
}

Assistant:

int ffppni( fitsfile *fptr,  /* I - FITS file pointer                       */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            short *array,    /* I - array of values that are written        */
            short nulval,    /* I - undefined pixel value                   */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).  Any array values
  that are equal to the value of nulval will be replaced with the null
  pixel value that is appropriate for this column.
*/
{
    long row;
    short nullvalue;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        nullvalue = nulval;  /* set local variable */
        fits_write_compressed_pixels(fptr, TSHORT, firstelem, nelem,
            1, array, &nullvalue, status);
        return(*status);
    }

    row=maxvalue(1,group);

    ffpcni(fptr, 2, row, firstelem, nelem, array, nulval, status);
    return(*status);
}